

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O3

bool __thiscall higan::HttpRequest::SetVersion(HttpRequest *this,char *begin,char *end)

{
  int iVar1;
  HttpVersion HVar2;
  bool bVar3;
  size_type *local_40;
  string version;
  
  local_40 = &version._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 == 0) {
    HVar2 = HTTP_VERSION_10;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 != 0) {
      bVar3 = false;
      goto LAB_001183a2;
    }
    HVar2 = HTTP_VERSION_11;
  }
  this->version_ = HVar2;
  bVar3 = true;
LAB_001183a2:
  if (local_40 != &version._M_string_length) {
    operator_delete(local_40,version._M_string_length + 1);
  }
  return bVar3;
}

Assistant:

bool HttpRequest::SetVersion(const char* begin, const char* end)
{
	std::string version(begin, end);

	if (version == "HTTP/1.0")
	{
		version_ = HTTP_VERSION_10;
	}
	else if (version == "HTTP/1.1")
	{
		version_ = HTTP_VERSION_11;
	}
	else
	{
		return false;
	}

	return true;
}